

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O1

void test_dt_byte(void)

{
  char cVar1;
  char cVar2;
  XSValue *pXVar3;
  wchar16 *pwVar4;
  char *pcVar5;
  long lVar6;
  void *pvVar7;
  char *pcVar8;
  int iVar9;
  bool bVar10;
  Status myStatus;
  char lex_v_ran_iv_2 [5];
  char lex_v_ran_iv_1 [5];
  Status myStatus_14;
  char lex_v_ran_v_2 [5];
  char lex_v_ran_v_1 [5];
  char lex_iv_2 [8];
  char data_canrep_2 [4];
  char data_canrep_1 [4];
  char lex_v_ran_v_1_canrep [4];
  char lex_iv_1 [9];
  char lex_v_ran_v_2_canrep [5];
  char lex_v_ran_iv_2_canrep [5];
  char lex_v_ran_iv_1_canrep [4];
  char data_rawstr_2 [7];
  char data_rawstr_1 [12];
  char lex_v_ran_v_0 [10];
  StrX local_d8;
  char *local_c8;
  char local_bc [8];
  char local_b4 [8];
  Status local_ac;
  char local_a8 [8];
  char local_a0 [8];
  char local_98 [12];
  char local_8c [4];
  undefined4 local_88;
  char local_84 [4];
  undefined8 local_80;
  undefined1 local_78;
  char local_70 [8];
  char local_68 [8];
  char local_60 [4];
  int local_5c;
  char local_58 [8];
  char local_50 [16];
  char local_40 [16];
  
  builtin_strncpy(local_40,"   12   \n",10);
  builtin_strncpy(local_a0,"+127",5);
  builtin_strncpy(local_a8,"-128",5);
  builtin_strncpy(local_b4,"+128",5);
  builtin_strncpy(local_bc,"-129",5);
  builtin_strncpy(local_84,"127",4);
  builtin_strncpy(local_70,"-128",5);
  builtin_strncpy(local_60,"128",4);
  builtin_strncpy(local_68,"-129",5);
  local_78 = 0;
  local_80 = 0x3635342e34333231;
  builtin_strncpy(local_98,"1234b56",8);
  builtin_strncpy(local_50,"   +123   \n",0xc);
  local_88 = 0x333231;
  builtin_strncpy(local_58,"000123",7);
  builtin_strncpy(local_8c,"123",4);
  local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
  local_d8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_d8.fUnicodeForm,dt_byte,(Status *)&local_c8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d8);
  if (cVar2 == '\0') {
    StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x8bc,local_40,local_d8.fLocalForm,1);
    StrX::~StrX(&local_d8);
    errSeen = 1;
  }
  local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
  local_d8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_d8.fUnicodeForm,dt_byte,(Status *)&local_c8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d8);
  if (cVar2 == '\0') {
    StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x8bd,local_a0,local_d8.fLocalForm,1);
    StrX::~StrX(&local_d8);
    errSeen = 1;
  }
  local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
  local_d8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_d8.fUnicodeForm,dt_byte,(Status *)&local_c8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d8);
  if (cVar2 == '\0') {
    StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x8be,local_a8,local_d8.fLocalForm,1);
    StrX::~StrX(&local_d8);
    errSeen = 1;
  }
  local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
  local_d8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_b4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_b4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_d8.fUnicodeForm,dt_byte,(Status *)&local_c8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d8);
  if (cVar2 == '\0') {
    if ((int)local_c8 != 6) {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      if (((ulong)local_c8 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_c8 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x8c1,local_b4,local_d8.fLocalForm,"st_FOCA0002",pcVar8);
      goto LAB_001138ea;
    }
  }
  else {
    StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x8c1,local_b4,local_d8.fLocalForm,0);
LAB_001138ea:
    StrX::~StrX(&local_d8);
    errSeen = 1;
  }
  local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
  local_d8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_bc,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_bc,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_d8.fUnicodeForm,dt_byte,(Status *)&local_c8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d8);
  if (cVar2 == '\0') {
    if ((int)local_c8 != 6) {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      if (((ulong)local_c8 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_c8 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x8c2,local_bc,local_d8.fLocalForm,"st_FOCA0002",pcVar8);
      goto LAB_001139de;
    }
  }
  else {
    StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x8c2,local_bc,local_d8.fLocalForm,0);
LAB_001139de:
    StrX::~StrX(&local_d8);
    errSeen = 1;
  }
  local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
  local_d8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_d8.fUnicodeForm,dt_byte,(Status *)&local_c8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d8);
  if (cVar2 == '\0') {
    if ((int)local_c8 != 6) {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      if (((ulong)local_c8 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_c8 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x8c5,&local_80,local_d8.fLocalForm,"st_FOCA0002",pcVar8);
      goto LAB_00113ad2;
    }
  }
  else {
    StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x8c5,&local_80,local_d8.fLocalForm,0);
LAB_00113ad2:
    StrX::~StrX(&local_d8);
    errSeen = 1;
  }
  local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
  local_d8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_98,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_98,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_d8.fUnicodeForm,dt_byte,(Status *)&local_c8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d8);
  if (cVar2 == '\0') {
    if ((int)local_c8 != 6) {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      if (((ulong)local_c8 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_c8 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x8c6,local_98,local_d8.fLocalForm,"st_FOCA0002",pcVar8);
      goto LAB_00113bc6;
    }
  }
  else {
    StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x8c6,local_98,local_d8.fLocalForm,0);
LAB_00113bc6:
    StrX::~StrX(&local_d8);
    errSeen = 1;
  }
  iVar9 = 1;
  do {
    local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
    local_5c = iVar9;
    local_d8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_d8.fUnicodeForm,dt_byte,(Status *)&local_c8,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d8);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x8e3,local_40);
      StrX::~StrX(&local_d8);
      errSeen = 1;
    }
    else {
      pvVar7 = (void *)(ulong)(uint)(int)(char)pXVar3[8];
      if ((int)(char)pXVar3[8] != 0xc) {
        printf("ACTVALUE_TEST Unexpected dt_byte XSValue, got %d expected %d\n",pvVar7,0xc);
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    iVar9 = local_5c;
    bVar10 = local_5c == 1;
    local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
    local_d8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_d8.fUnicodeForm,dt_byte,(Status *)&local_c8,ver_10,bVar10,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d8);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x8e5,local_a0);
      StrX::~StrX(&local_d8);
      errSeen = 1;
    }
    else {
      pvVar7 = (void *)(ulong)(uint)(int)(char)pXVar3[8];
      if ((int)(char)pXVar3[8] != 0x7f) {
        printf("ACTVALUE_TEST Unexpected dt_byte XSValue, got %d expected %d\n",pvVar7,0x7f);
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
    local_d8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_d8.fUnicodeForm,dt_byte,(Status *)&local_c8,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d8);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x8e6,local_a8);
      StrX::~StrX(&local_d8);
      errSeen = 1;
    }
    else {
      pvVar7 = (void *)(ulong)(uint)(int)(char)pXVar3[8];
      if ((int)(char)pXVar3[8] != 0xffffff80) {
        printf("ACTVALUE_TEST Unexpected dt_byte XSValue, got %d expected %d\n",pvVar7,0xffffff80);
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
    local_d8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_b4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_b4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_d8.fUnicodeForm,dt_byte,(Status *)&local_c8,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d8);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_c8 != 6) {
        StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_c8 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_c8 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x8e7,local_b4,local_d8.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_d8);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      pvVar7 = (void *)0x8e7;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x8e7,local_b4);
      StrX::~StrX(&local_d8);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
    local_d8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_bc,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_bc,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_d8.fUnicodeForm,dt_byte,(Status *)&local_c8,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d8);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_c8 != 6) {
        StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_c8 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_c8 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x8e8,local_bc,local_d8.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_d8);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      pvVar7 = (void *)0x8e8;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x8e8,local_bc);
      StrX::~StrX(&local_d8);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
    local_d8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_d8.fUnicodeForm,dt_byte,(Status *)&local_c8,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d8);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_c8 != 6) {
        StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_c8 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_c8 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x8ea,&local_80,local_d8.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_d8);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      pvVar7 = (void *)0x8ea;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x8ea,&local_80);
      StrX::~StrX(&local_d8);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
    local_d8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_98,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_98,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_d8.fUnicodeForm,dt_byte,(Status *)&local_c8,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d8);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_c8 != 6) {
        StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_c8 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_c8 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x8eb,local_98,local_d8.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_d8);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      pvVar7 = (void *)0x8eb;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x8eb,local_98);
      StrX::~StrX(&local_d8);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    iVar9 = iVar9 + -1;
  } while (iVar9 == 0);
  iVar9 = 0;
  do {
    local_ac = st_Init;
    local_d8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_d8.fUnicodeForm,dt_byte,&local_ac,ver_10,iVar9 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d8);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x909,local_50);
      StrX::~StrX(&local_d8);
      errSeen = 1;
    }
    else {
      local_c8 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar8 = (char *)&local_88;
      if (local_c8 != pcVar8) {
        pcVar5 = local_c8;
        if (local_c8 == (char *)0x0) {
LAB_001143bc:
          if (*pcVar8 == '\0') goto LAB_00114409;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_001143bc;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x909,local_50,local_d8.fLocalForm,local_c8,&local_88);
        StrX::~StrX(&local_d8);
        errSeen = 1;
      }
LAB_00114409:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_ac = st_Init;
    local_d8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_d8.fUnicodeForm,dt_byte,&local_ac,ver_10,iVar9 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d8);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x90a,local_58);
      StrX::~StrX(&local_d8);
      errSeen = 1;
    }
    else {
      local_c8 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar8 = local_8c;
      if (local_c8 != pcVar8) {
        pcVar5 = local_c8;
        if (local_c8 == (char *)0x0) {
LAB_00114506:
          if (*pcVar8 == '\0') goto LAB_00114553;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_00114506;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x90a,local_58,local_d8.fLocalForm,local_c8,local_8c);
        StrX::~StrX(&local_d8);
        errSeen = 1;
      }
LAB_00114553:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_ac = st_Init;
    local_d8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_d8.fUnicodeForm,dt_byte,&local_ac,ver_10,iVar9 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d8);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x90c,local_a0);
      StrX::~StrX(&local_d8);
      errSeen = 1;
    }
    else {
      local_c8 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar8 = local_84;
      if (local_c8 != pcVar8) {
        pcVar5 = local_c8;
        if (local_c8 == (char *)0x0) {
LAB_0011464a:
          if (*pcVar8 == '\0') goto LAB_00114694;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_0011464a;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x90c,local_a0,local_d8.fLocalForm,local_c8,local_84);
        StrX::~StrX(&local_d8);
        errSeen = 1;
      }
LAB_00114694:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_ac = st_Init;
    local_d8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_d8.fUnicodeForm,dt_byte,&local_ac,ver_10,iVar9 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d8);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x90d,local_a8);
      StrX::~StrX(&local_d8);
      errSeen = 1;
    }
    else {
      local_c8 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar8 = local_70;
      if (local_c8 != pcVar8) {
        pcVar5 = local_c8;
        if (local_c8 == (char *)0x0) {
LAB_00114790:
          if (*pcVar8 == '\0') goto LAB_001147da;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_00114790;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x90d,local_a8,local_d8.fLocalForm,local_c8,local_70);
        StrX::~StrX(&local_d8);
        errSeen = 1;
      }
LAB_001147da:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
    local_d8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_d8.fUnicodeForm,dt_byte,(Status *)&local_c8,ver_10,iVar9 == 0,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d8);
    if (lVar6 == 0) {
      if ((int)local_c8 != 6) {
        StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_c8 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_c8 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x90f,&local_80,local_d8.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_d8);
        goto LAB_001148f4;
      }
    }
    else {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x90f,&local_80);
      StrX::~StrX(&local_d8);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_001148f4:
      errSeen = 1;
    }
    local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
    local_d8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_98,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_d8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_98,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_d8.fUnicodeForm,dt_byte,(Status *)&local_c8,ver_10,iVar9 == 0,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d8);
    if (lVar6 == 0) {
      if ((int)local_c8 != 6) {
        StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_c8 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_c8 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x910,local_98,local_d8.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_d8);
        goto LAB_001149fc;
      }
    }
    else {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x910,local_98);
      StrX::~StrX(&local_d8);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_001149fc:
      errSeen = 1;
    }
    bVar10 = iVar9 == 0;
    iVar9 = iVar9 + 1;
  } while (bVar10);
  local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
  local_d8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_b4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_b4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_d8.fUnicodeForm,dt_byte,(Status *)&local_c8,ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d8);
  if (lVar6 == 0) {
    if ((int)local_c8 != 6) {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      if (((ulong)local_c8 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_c8 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x915,local_b4,local_d8.fLocalForm,"st_FOCA0002",pcVar8);
      StrX::~StrX(&local_d8);
      goto LAB_00114b17;
    }
  }
  else {
    StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x915,local_b4);
    StrX::~StrX(&local_d8);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_00114b17:
    errSeen = 1;
  }
  local_c8 = (char *)((ulong)local_c8 & 0xffffffff00000000);
  local_d8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_bc,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_bc,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_d8.fUnicodeForm,dt_byte,(Status *)&local_c8,ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d8);
  if (lVar6 == 0) {
    if ((int)local_c8 != 6) {
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      if (((ulong)local_c8 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_c8 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x916,local_bc,local_d8.fLocalForm,"st_FOCA0002",pcVar8);
      StrX::~StrX(&local_d8);
      goto LAB_00114c22;
    }
  }
  else {
    StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x916,local_bc);
    StrX::~StrX(&local_d8);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_00114c22:
    errSeen = 1;
  }
  local_ac = st_Init;
  local_d8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_b4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_b4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pwVar4 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_d8.fUnicodeForm,dt_byte,&local_ac,ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d8);
  if (pwVar4 == (wchar16 *)0x0) {
    StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x919,local_b4);
    StrX::~StrX(&local_d8);
    errSeen = 1;
  }
  else {
    local_c8 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar8 = local_60;
    if (local_c8 != pcVar8) {
      pcVar5 = local_c8;
      if (local_c8 == (char *)0x0) {
LAB_00114cfc:
        if (*pcVar8 == '\0') goto LAB_00114d48;
      }
      else {
        do {
          cVar2 = *pcVar5;
          if (cVar2 == '\0') goto LAB_00114cfc;
          pcVar5 = pcVar5 + 1;
          cVar1 = *pcVar8;
          pcVar8 = pcVar8 + 1;
        } while (cVar2 == cVar1);
      }
      StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x919,local_b4,local_d8.fLocalForm,local_c8,local_60);
      StrX::~StrX(&local_d8);
      errSeen = 1;
    }
LAB_00114d48:
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
    xercesc_4_0::XMLString::release(&local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  local_ac = st_Init;
  local_d8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_bc,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_d8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_bc,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pwVar4 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_d8.fUnicodeForm,dt_byte,&local_ac,ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_d8);
  if (pwVar4 == (wchar16 *)0x0) {
    StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x91a,local_bc,local_d8.fLocalForm);
    StrX::~StrX(&local_d8);
    errSeen = 1;
    return;
  }
  local_c8 = (char *)xercesc_4_0::XMLString::transcode
                               (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pcVar8 = local_68;
  if (local_c8 != pcVar8) {
    pcVar5 = local_c8;
    if (local_c8 == (char *)0x0) {
LAB_00114e36:
      if (*pcVar8 == '\0') goto LAB_00114e82;
    }
    else {
      do {
        cVar2 = *pcVar5;
        if (cVar2 == '\0') goto LAB_00114e36;
        pcVar5 = pcVar5 + 1;
        cVar1 = *pcVar8;
        pcVar8 = pcVar8 + 1;
      } while (cVar2 == cVar1);
    }
    StrX::StrX(&local_d8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
           ,0x91a,local_bc,local_d8.fLocalForm,local_c8,local_68);
    StrX::~StrX(&local_d8);
    errSeen = 1;
  }
LAB_00114e82:
  (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
            (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
  xercesc_4_0::XMLString::release(&local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  return;
}

Assistant:

void test_dt_byte()
{
    const XSValue::DataType dt = XSValue::dt_byte;
    bool  toValidate = true;

    const char lex_v_ran_v_0[]="   12   \n";

    const char lex_v_ran_v_1[]="+127";
    const char lex_v_ran_v_2[]="-128";
    const char lex_v_ran_iv_1[]="+128";
    const char lex_v_ran_iv_2[]="-129";

    XSValue::XSValue_Data act_v_ran_v_0;   act_v_ran_v_0.fValue.f_char = (char)12;
    XSValue::XSValue_Data act_v_ran_v_1;   act_v_ran_v_1.fValue.f_char = (char)+127;
    XSValue::XSValue_Data act_v_ran_v_2;   act_v_ran_v_2.fValue.f_char = (char)-128;

    const char lex_v_ran_v_1_canrep[]="127";
    const char lex_v_ran_v_2_canrep[]="-128";
    const char lex_v_ran_iv_1_canrep[]="128";
    const char lex_v_ran_iv_2_canrep[]="-129";

    const char lex_iv_1[]="1234.456";
    const char lex_iv_2[]="1234b56";

/***
 *
 * 3.3.19.2 Canonical representation
 *
 * The canonical representation for byte is defined by prohibiting certain options from the
 * Lexical representation (3.3.19.1). Specifically,
 * 1. the the optional "+" sign is prohibited and
 * 2. leading zeroes are prohibited.
 *
 ***/

    const char data_rawstr_1[]="   +123   \n";
    const char data_canrep_1[]="123";
    const char data_rawstr_2[]="000123";
    const char data_canrep_2[]="123";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid                         false           st_FOCA0002
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid, valid range
    VALIDATE_TEST(lex_v_ran_v_0  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_1  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_2  , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical valid, invalid range
    VALIDATE_TEST(lex_v_ran_iv_1 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_v_ran_iv_2 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        ACTVALUE_TEST(lex_v_ran_v_0,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_0);

        ACTVALUE_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_v_ran_iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);

        ACTVALUE_TEST(lex_iv_1,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_iv_2,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                              0            st_FOCA0002
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh         n/a
     *          range  invalid                            XMLCh         n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j)? true : false;

        CANREP_TEST(data_rawstr_1, dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,        DONT_CARE);
        CANREP_TEST(data_rawstr_2, dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,        XSValue::st_FOCA0002);

        CANREP_TEST(lex_v_ran_v_1, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_1_canrep, DONT_CARE);
        CANREP_TEST(lex_v_ran_v_2, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_2_canrep, DONT_CARE);

        CANREP_TEST(lex_iv_1,      dt, toValidate, EXP_RET_CANREP_FALSE, null_string,          XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2,      dt, toValidate, EXP_RET_CANREP_FALSE, null_string,          XSValue::st_FOCA0002);

    }

    //validation on
    CANREP_TEST(lex_v_ran_iv_1, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
    CANREP_TEST(lex_v_ran_iv_2, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);

    //validation off
    CANREP_TEST(lex_v_ran_iv_1, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_1_canrep, DONT_CARE);
    CANREP_TEST(lex_v_ran_iv_2, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_2_canrep, DONT_CARE);
}